

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledBox.cpp
# Opt level: O0

void __thiscall
Rml::DecoratorTiledBoxInstancer::DecoratorTiledBoxInstancer(DecoratorTiledBoxInstancer *this)

{
  allocator<char> local_1d1;
  String local_1d0;
  allocator<char> local_1a9;
  String local_1a8;
  allocator<char> local_181;
  String local_180;
  allocator<char> local_159;
  String local_158;
  allocator<char> local_131;
  String local_130;
  allocator<char> local_109;
  String local_108;
  allocator<char> local_e1;
  String local_e0;
  allocator<char> local_b9;
  String local_b8;
  allocator<char> local_91;
  String local_90;
  allocator<char> local_69;
  String local_68;
  allocator<char> local_31;
  String local_30;
  DecoratorTiledBoxInstancer *local_10;
  DecoratorTiledBoxInstancer *this_local;
  
  local_10 = this;
  DecoratorTiledInstancer::DecoratorTiledInstancer(&this->super_DecoratorTiledInstancer,9);
  (this->super_DecoratorTiledInstancer).super_DecoratorInstancer._vptr_DecoratorInstancer =
       (_func_int **)&PTR__DecoratorTiledBoxInstancer_00816080;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"top-left-image",&local_31);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&local_30,false);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator(&local_31);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"top-right-image",&local_69);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&local_68,false);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::allocator<char>::~allocator(&local_69);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"bottom-left-image",&local_91);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&local_90,false);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::allocator<char>::~allocator(&local_91);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"bottom-right-image",&local_b9);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&local_b8,false);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::allocator<char>::~allocator(&local_b9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"left-image",&local_e1);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&local_e0,false);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::allocator<char>::~allocator(&local_e1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"right-image",&local_109);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&local_108,false);
  ::std::__cxx11::string::~string((string *)&local_108);
  ::std::allocator<char>::~allocator(&local_109);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"top-image",&local_131);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&local_130,false);
  ::std::__cxx11::string::~string((string *)&local_130);
  ::std::allocator<char>::~allocator(&local_131);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"bottom-image",&local_159);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&local_158,false);
  ::std::__cxx11::string::~string((string *)&local_158);
  ::std::allocator<char>::~allocator(&local_159);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"center-image",&local_181);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&local_180,false);
  ::std::__cxx11::string::~string((string *)&local_180);
  ::std::allocator<char>::~allocator(&local_181);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"decorator",&local_1a9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,
             "top-left-image, top-image, top-right-image, left-image, center-image, right-image, bottom-left-image, bottom-image, bottom-right-image"
             ,&local_1d1);
  EffectSpecification::RegisterShorthand
            (&(this->super_DecoratorTiledInstancer).super_DecoratorInstancer.
              super_EffectSpecification,&local_1a8,&local_1d0,RecursiveCommaSeparated);
  ::std::__cxx11::string::~string((string *)&local_1d0);
  ::std::allocator<char>::~allocator(&local_1d1);
  ::std::__cxx11::string::~string((string *)&local_1a8);
  ::std::allocator<char>::~allocator(&local_1a9);
  return;
}

Assistant:

DecoratorTiledBoxInstancer::DecoratorTiledBoxInstancer() : DecoratorTiledInstancer(9)
{
	RegisterTileProperty("top-left-image");
	RegisterTileProperty("top-right-image");
	RegisterTileProperty("bottom-left-image");
	RegisterTileProperty("bottom-right-image");

	RegisterTileProperty("left-image");
	RegisterTileProperty("right-image");
	RegisterTileProperty("top-image");
	RegisterTileProperty("bottom-image");

	RegisterTileProperty("center-image");

	RegisterShorthand("decorator",
		"top-left-image, top-image, top-right-image, left-image, center-image, right-image, bottom-left-image, bottom-image, bottom-right-image",
		ShorthandType::RecursiveCommaSeparated);
}